

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O0

Bdd __thiscall
sylvan::Bdd::VectorCube(Bdd *this,vector<sylvan::Bdd,_std::allocator<sylvan::Bdd>_> *variables)

{
  size_type sVar1;
  const_reference other;
  undefined4 local_20;
  int i;
  vector<sylvan::Bdd,_std::allocator<sylvan::Bdd>_> *variables_local;
  Bdd *result;
  
  bddOne();
  sVar1 = std::vector<sylvan::Bdd,_std::allocator<sylvan::Bdd>_>::size(variables);
  local_20 = (int)sVar1;
  while (local_20 = local_20 + -1, -1 < local_20) {
    other = std::vector<sylvan::Bdd,_std::allocator<sylvan::Bdd>_>::operator[]
                      (variables,(long)local_20);
    operator*=(this,other);
  }
  return (Bdd)(BDD)this;
}

Assistant:

Bdd
Bdd::VectorCube(const std::vector<Bdd> variables)
{
    Bdd result = Bdd::bddOne();
    for (int i=variables.size()-1; i>=0; i--) {
        result *= variables[i];
    }
    return result;
}